

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

int mxx::exscan<int,mxx::min<int>>(undefined8 x,long param_2,undefined4 param_3)

{
  int iVar1;
  int result;
  custom_op<int> op;
  
  custom_op<int>::custom_op<mxx::min<int>>(&op,param_3);
  MPI_Exscan(x,&result,1,op.m_type_copy,op.m_op,*(undefined8 *)(param_2 + 8));
  iVar1 = *(int *)(param_2 + 0x14);
  if (*(int *)(param_2 + 0x14) != 0) {
    iVar1 = result;
  }
  custom_op<int>::~custom_op(&op);
  return iVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm(), const bool commutative = true) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func), commutative);
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}